

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void RulePrint(FILE *fp,rule *rp,int iCursor)

{
  symbol *psVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  
  fprintf((FILE *)fp,"%s ::=",rp->lhs->name);
  if (-1 < rp->nrhs) {
    uVar4 = 0;
    do {
      if (uVar4 == (uint)iCursor) {
        fwrite(" *",2,1,(FILE *)fp);
      }
      if (uVar4 == (uint)rp->nrhs) {
        return;
      }
      psVar1 = rp->rhs[uVar4];
      if (psVar1->type == MULTITERMINAL) {
        fprintf((FILE *)fp," %s",(*psVar1->subsym)->name);
        if (1 < psVar1->nsubsym) {
          lVar3 = 1;
          do {
            fprintf((FILE *)fp,"|%s",psVar1->subsym[lVar3]->name);
            lVar3 = lVar3 + 1;
          } while (lVar3 < psVar1->nsubsym);
        }
      }
      else {
        fprintf((FILE *)fp," %s",psVar1->name);
      }
      bVar2 = (long)uVar4 < (long)rp->nrhs;
      uVar4 = uVar4 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void RulePrint(FILE *fp, struct rule *rp, int iCursor){
  struct symbol *sp;
  int i, j;
  fprintf(fp,"%s ::=",rp->lhs->name);
  for(i=0; i<=rp->nrhs; i++){
    if( i==iCursor ) fprintf(fp," *");
    if( i==rp->nrhs ) break;
    sp = rp->rhs[i];
    if( sp->type==MULTITERMINAL ){
      fprintf(fp," %s", sp->subsym[0]->name);
      for(j=1; j<sp->nsubsym; j++){
        fprintf(fp,"|%s",sp->subsym[j]->name);
      }
    }else{
      fprintf(fp," %s", sp->name);
    }
  }
}